

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O3

bool icu_63::number::impl::blueprint_helpers::parseExponentWidthOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *param_3)

{
  char16_t cVar1;
  int32_t iVar2;
  bool bVar3;
  int index;
  Notation NVar4;
  int minExponentDigits;
  
  bVar3 = false;
  minExponentDigits = 0;
  cVar1 = numparse::impl::StringSegment::charAt(segment,0);
  if (cVar1 == L'+') {
    iVar2 = numparse::impl::StringSegment::length(segment);
    index = 1;
    if (1 < iVar2) {
      index = 1;
      do {
        cVar1 = numparse::impl::StringSegment::charAt(segment,index);
        if (cVar1 != L'e') break;
        index = index + 1;
        iVar2 = numparse::impl::StringSegment::length(segment);
      } while (index < iVar2);
      minExponentDigits = index + -1;
    }
    iVar2 = numparse::impl::StringSegment::length(segment);
    if (index < iVar2) {
      bVar3 = false;
    }
    else {
      NVar4 = (Notation)
              ScientificNotation::withMinExponentDigits
                        ((ScientificNotation *)&macros->notation,minExponentDigits);
      macros->notation = NVar4;
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool blueprint_helpers::parseExponentWidthOption(const StringSegment& segment, MacroProps& macros,
                                                 UErrorCode&) {
    if (segment.charAt(0) != u'+') {
        return false;
    }
    int32_t offset = 1;
    int32_t minExp = 0;
    for (; offset < segment.length(); offset++) {
        if (segment.charAt(offset) == u'e') {
            minExp++;
        } else {
            break;
        }
    }
    if (offset < segment.length()) {
        return false;
    }
    // Use the public APIs to enforce bounds checking
    macros.notation = static_cast<ScientificNotation&>(macros.notation).withMinExponentDigits(minExp);
    return true;
}